

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Functional::ShaderDataSpec::ShaderDataSpec(ShaderDataSpec *this)

{
  long lVar1;
  
  (this->resultScale).m_isConstant = true;
  (this->resultScale).m_value.symbol = 0x3f800000;
  (this->resultBias).m_isConstant = true;
  (this->resultBias).m_value.constant = 0.0;
  (this->referenceScale).m_isConstant = true;
  (this->referenceScale).m_value.symbol = 0x3f800000;
  (this->referenceBias).m_isConstant = true;
  *(undefined8 *)&(this->referenceBias).m_value = 0x300000000;
  this->output = TYPE_LAST;
  this->numInputs = 0;
  lVar1 = 0;
  do {
    *(undefined4 *)((long)&this->inputs[0].type + lVar1) = 0x5e;
    (&this->inputs[0].rangeMin.m_isConstant)[lVar1] = true;
    *(undefined4 *)((long)&this->inputs[0].rangeMin.m_value + lVar1) = 0;
    (&this->inputs[0].rangeMax.m_isConstant)[lVar1] = true;
    *(undefined4 *)((long)&this->inputs[0].rangeMax.m_value + lVar1) = 0;
    lVar1 = lVar1 + 0x14;
  } while (lVar1 != 0x3c);
  return;
}

Assistant:

ShaderDataSpec (void)
		: resultScale		(1.0f)
		, resultBias		(0.0f)
		, referenceScale	(1.0f)
		, referenceBias		(0.0f)
		, precision			(PRECISION_LAST)
		, output			(TYPE_LAST)
		, numInputs			(0)
	{
	}